

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
model::model(model *this,unsigned_long num_features,float alpha,float beta,float lambda1,
            float lambda2)

{
  float lambda2_local;
  float lambda1_local;
  float beta_local;
  float alpha_local;
  unsigned_long num_features_local;
  model *this_local;
  
  this->num_features = num_features;
  this->alpha = alpha;
  this->beta = beta;
  this->lambda1 = lambda1;
  this->lambda2 = lambda2;
  std::vector<float,_std::allocator<float>_>::vector(&this->w);
  std::vector<float,_std::allocator<float>_>::vector(&this->z);
  std::vector<float,_std::allocator<float>_>::vector(&this->n);
  init_model(this);
  return;
}

Assistant:

model::model(unsigned long num_features, float alpha, float beta, float lambda1, float lambda2)
        : num_features(num_features), alpha(alpha), beta(beta), lambda1(lambda1), lambda2(lambda2) {init_model();}